

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::basic_param::cla_name_help
          (basic_param *this,ostream *ostr,cstring *cla_tag,cstring *param_4)

{
  basic_cstring<const_char> *in_stack_00000038;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_00000040;
  
  unit_test::operator<<(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

virtual void            cla_name_help( std::ostream& ostr, cstring cla_tag, cstring /* negation_prefix_ */) const
    {
        ostr << cla_tag;
    }